

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* cxxopts::values::parser_tool::SplitSwitchDef
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *text)

{
  long lVar1;
  sub_match<const_char_*> *psVar2;
  match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> result;
  string_type local_58;
  string_type local_38;
  
  result.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  result._M_begin = (char *)0x0;
  result.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  result.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  regex_match<char,std::allocator<std::__cxx11::sub_match<char_const*>>,std::__cxx11::regex_traits<char>>
            ((text->_M_dataplus)._M_p,&result,
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             (anonymous_namespace)::option_specifier_abi_cxx11_,0);
  lVar1 = (long)result.
                super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)result.
                super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)(lVar1 / 0x18) < 4) {
    throw_or_mimic<cxxopts::invalid_option_format_error>(text);
    lVar1 = (long)result.
                  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)result.
                  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  }
  if ((result.
       super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
       .
       super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       result.
       super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
       .
       super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) || (0xfffffffffffffffc < lVar1 / 0x18 - 6U)) {
    psVar2 = (sub_match<const_char_*> *)
             ((long)&result.
                     super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                     .
                     super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[-3].
                     super_pair<const_char_*,_const_char_*>.first + lVar1);
  }
  else {
    psVar2 = result.
             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             .
             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 2;
  }
  std::__cxx11::sub_match<const_char_*>::str(&local_38,psVar2);
  lVar1 = (long)result.
                super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)result.
                super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if ((lVar1 == 0) || (0xfffffffffffffffb < lVar1 / 0x18 - 7U)) {
    psVar2 = (sub_match<const_char_*> *)
             ((long)result.
                    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar1 + -0x48);
  }
  else {
    psVar2 = result.
             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             .
             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 3;
  }
  std::__cxx11::sub_match<const_char_*>::str(&local_58,psVar2);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (__return_storage_ptr__,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::
  _Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   *)&result);
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<std::string, std::string> SplitSwitchDef(const std::string &text)
      {
        std::match_results<const char*> result;
        std::regex_match(text.c_str(), result, option_specifier);
        if (result.empty())
        {
          throw_or_mimic<invalid_option_format_error>(text);
        }

        const std::string& short_sw = result[2];
        const std::string& long_sw = result[3];

        return std::pair<std::string, std::string>(short_sw, long_sw);
      }